

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTMLparser.c
# Opt level: O1

htmlDocPtr htmlReadFile(char *filename,char *encoding,int options)

{
  htmlParserCtxtPtr ctxt;
  htmlDocPtr pxVar1;
  
  xmlInitParser();
  ctxt = htmlCreateFileParserCtxt(filename,encoding);
  if (ctxt != (htmlParserCtxtPtr)0x0) {
    pxVar1 = htmlDoRead(ctxt,(char *)0x0,(char *)0x0,options,0);
    return pxVar1;
  }
  return (htmlDocPtr)0x0;
}

Assistant:

htmlDocPtr
htmlReadFile(const char *filename, const char *encoding, int options)
{
    htmlParserCtxtPtr ctxt;

    xmlInitParser();
    ctxt = htmlCreateFileParserCtxt(filename, encoding);
    if (ctxt == NULL)
        return (NULL);
    return (htmlDoRead(ctxt, NULL, NULL, options, 0));
}